

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_set_compression_bzip2(archive *_a)

{
  int iVar1;
  char *fmt;
  bool bVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,7,"archive_write_zip_set_compression_bzip2");
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    bVar2 = _a->archive_format == 0x50000;
    fmt = "Can only use archive_write_zip_set_compression_bzip2 with zip format";
    if (bVar2) {
      fmt = "bzip2 compression not supported";
    }
    iVar1 = (uint)bVar2 * 5 + -0x1e;
    archive_set_error(_a,-1,fmt);
  }
  return iVar1;
}

Assistant:

int
archive_write_zip_set_compression_bzip2(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	int ret = ARCHIVE_FAILED;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
		ARCHIVE_STATE_NEW | ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
		"archive_write_zip_set_compression_bzip2");
	if (a->archive.archive_format != ARCHIVE_FORMAT_ZIP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		"Can only use archive_write_zip_set_compression_bzip2"
		" with zip format");
		ret = ARCHIVE_FATAL;
	} else {
#ifdef HAVE_BZLIB_H
		struct zip *zip = a->format_data;
		zip->requested_compression = COMPRESSION_BZIP2;
		ret = ARCHIVE_OK;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"bzip2 compression not supported");
		ret = ARCHIVE_FAILED;
#endif
	}
	return (ret);
}